

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
GdlRenderer::DebugRulePrecedence(GdlRenderer *this,GrcManager *pcman,ostream *strmOut)

{
  GdlRuleTable *pGVar1;
  GdlRuleTable *prultbl;
  allocator local_c9;
  string local_c8 [8];
  string *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  ostream *in_stack_ffffffffffffff50;
  GrcManager *in_stack_ffffffffffffff58;
  GdlRuleTable *in_stack_ffffffffffffff60;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  GdlRuleTable *local_20;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"linebreak",&local_41);
  pGVar1 = FindRuleTable((GdlRenderer *)
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         in_stack_ffffffffffffff40);
  local_20 = pGVar1;
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (pGVar1 != (GdlRuleTable *)0x0) {
    GdlRuleTable::DebugRulePrecedence
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff4c);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"substitution",&local_79);
  pGVar1 = FindRuleTable((GdlRenderer *)
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         in_stack_ffffffffffffff40);
  local_20 = pGVar1;
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  if (pGVar1 != (GdlRuleTable *)0x0) {
    GdlRuleTable::DebugRulePrecedence
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff4c);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff60,"justification",
             (allocator *)&stack0xffffffffffffff5f);
  pGVar1 = FindRuleTable((GdlRenderer *)
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         in_stack_ffffffffffffff40);
  local_20 = pGVar1;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff5f);
  if (pGVar1 != (GdlRuleTable *)0x0) {
    GdlRuleTable::DebugRulePrecedence
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff4c);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"positioning",&local_c9);
  pGVar1 = FindRuleTable((GdlRenderer *)
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         in_stack_ffffffffffffff40);
  local_20 = pGVar1;
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  if (pGVar1 != (GdlRuleTable *)0x0) {
    GdlRuleTable::DebugRulePrecedence
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff4c);
  }
  return;
}

Assistant:

void GdlRenderer::DebugRulePrecedence(GrcManager * pcman, std::ostream & strmOut)
{
	GdlRuleTable * prultbl;

	if ((prultbl = FindRuleTable("linebreak")) != NULL)
		prultbl->DebugRulePrecedence(pcman, strmOut, m_ipassBidi);

	if ((prultbl = FindRuleTable("substitution")) != NULL)
		prultbl->DebugRulePrecedence(pcman, strmOut, m_ipassBidi);

	if ((prultbl = FindRuleTable("justification")) != NULL)
		prultbl->DebugRulePrecedence(pcman, strmOut, m_ipassBidi);

	if ((prultbl = FindRuleTable("positioning")) != NULL)
		prultbl->DebugRulePrecedence(pcman, strmOut, m_ipassBidi);
}